

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorImpl<std::pair<llvm::StringRef,llvm::StringRef>>::
emplace_back<std::pair<llvm::StringRef,llvm::StringRef>>
          (SmallVectorImpl<std::pair<llvm::StringRef,llvm::StringRef>> *this,
          pair<llvm::StringRef,_llvm::StringRef> *Args)

{
  undefined8 *puVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  
  if (*(uint *)(this + 0xc) <= *(uint *)(this + 8)) {
    emplace_back<std::pair<llvm::StringRef,llvm::StringRef>>(this);
  }
  lVar3 = *(long *)this;
  uVar2 = *(uint *)(this + 8);
  pcVar4 = (Args->first).Data;
  sVar5 = (Args->first).Length;
  sVar6 = (Args->second).Length;
  puVar1 = (undefined8 *)(lVar3 + 0x10 + (ulong)uVar2 * 0x20);
  *puVar1 = (Args->second).Data;
  puVar1[1] = sVar6;
  puVar1 = (undefined8 *)(lVar3 + (ulong)uVar2 * 0x20);
  *puVar1 = pcVar4;
  puVar1[1] = sVar5;
  if (*(uint *)(this + 8) < *(uint *)(this + 0xc)) {
    *(uint *)(this + 8) = *(uint *)(this + 8) + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
  }